

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::EqualElement<char[22]>::operator()
          (EqualElement<char[22]> *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          piecewise_construct_t *param_2,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_3,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_4)

{
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  __x = *lhs;
  __s = *(char **)this;
  sVar2 = strlen(__s);
  __y._M_str = __s;
  __y._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }